

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty.cpp
# Opt level: O2

string * __thiscall
cli::getPrettySize_abi_cxx11_(string *__return_storage_ptr__,cli *this,uint32_t size)

{
  uint uVar1;
  undefined1 *puVar2;
  double dVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  stringstream local_198 [16];
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [88];
  
  dVar3 = (double)((ulong)this & 0xffffffff);
  puVar2 = _ZZN3cli13getPrettySizeB5cxx11EjE8suffixes_rel;
  for (uVar1 = 0; (1024.0 <= dVar3 && (uVar1 < 4)); uVar1 = uVar1 + 1) {
    dVar3 = dVar3 * 0.0009765625;
    puVar2 = (undefined1 *)((long)puVar2 + 4);
  }
  std::__cxx11::stringstream::stringstream(local_198);
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 2;
  std::ostream::_M_insert<double>(dVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  std::operator+(__return_storage_ptr__,&local_1b8,
                 _ZZN3cli13getPrettySizeB5cxx11EjE8suffixes_rel + *(int *)puVar2);
  std::__cxx11::string::~string((string *)&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string getPrettySize(std::uint32_t size)
	{
		static const char *suffixes[] = { " B", " KiB", " MiB", " GiB", " TiB" };
		static const int suffixesSize = 5;

		int suffIndex = 0;
		double newSize = size;

		while ((newSize >= 1024.0) && (suffIndex < suffixesSize - 1))
		{
			++suffIndex;
			newSize /= 1024.0;
		}

		return toString(newSize, 2) + suffixes[suffIndex];
	}